

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void Action_add(action **app,e_action type,symbol *sp,char *arg)

{
  undefined1 auVar1 [16];
  action *paVar2;
  long lVar3;
  void *__ptr;
  undefined1 auVar4 [16];
  long lVar5;
  
  paVar2 = Action_new_actionfreelist;
  if (Action_new_actionfreelist == (action *)0x0) {
    __ptr = (void *)0x64;
    paVar2 = (action *)calloc(100,0x30);
    auVar1 = _DAT_0010d020;
    if (paVar2 == (action *)0x0) {
      Action_new_actionfreelist = paVar2;
      Action_add_cold_1();
      free(*(void **)((long)__ptr + 8));
      free(*(void **)((long)__ptr + 0x10));
      free(__ptr);
      return;
    }
    lVar3 = 0x50;
    auVar4 = _DAT_0010d010;
    do {
      lVar5 = auVar4._8_8_;
      if (SUB164(auVar4 ^ auVar1,4) == -0x80000000 && SUB164(auVar4 ^ auVar1,0) < -0x7fffff9d) {
        *(action **)((long)&paVar2[-1].sp + lVar3) = paVar2 + auVar4._0_8_ + 1;
        *(action **)((long)&paVar2->sp + lVar3) = paVar2 + lVar5 + 1;
      }
      auVar4._0_8_ = auVar4._0_8_ + 2;
      auVar4._8_8_ = lVar5 + 2;
      lVar3 = lVar3 + 0x60;
    } while (lVar3 != 0x1310);
    paVar2[99].next = (action *)0x0;
  }
  Action_new_actionfreelist = paVar2->next;
  paVar2->next = *app;
  *app = paVar2;
  paVar2->type = type;
  paVar2->sp = sp;
  paVar2->spOpt = (symbol *)0x0;
  (paVar2->x).stp = (state *)arg;
  return;
}

Assistant:

void Action_add(
  struct action **app,
  enum e_action type,
  struct symbol *sp,
  char *arg
){
  struct action *newaction;
  newaction = Action_new();
  newaction->next = *app;
  *app = newaction;
  newaction->type = type;
  newaction->sp = sp;
  newaction->spOpt = 0;
  if( type==SHIFT ){
    newaction->x.stp = (struct state *)arg;
  }else{
    newaction->x.rp = (struct rule *)arg;
  }
}